

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-01.cpp
# Opt level: O3

int __thiscall
baryonyx::itm::
solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
::select_variables(solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
                   *this,int r_size,int bkmin,int bkmax)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  double dVar7;
  
  iVar2 = bkmin;
  if (r_size < bkmin) {
    iVar2 = r_size;
  }
  iVar4 = iVar2;
  if (bkmin != bkmax) {
    iVar5 = bkmax;
    if (r_size < bkmax) {
      iVar5 = r_size;
    }
    iVar4 = iVar5;
    if (iVar2 <= bkmax) {
      if (bkmin < r_size) {
        r_size = bkmin;
      }
      iVar1 = iVar2;
      if (iVar2 < iVar5) {
        iVar1 = iVar5;
      }
      lVar6 = (long)r_size << 4;
      iVar3 = r_size;
      do {
        iVar4 = iVar3;
        dVar7 = *(double *)
                 ((long)&((this->R)._M_t.
                          super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
                          .
                          super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_false>
                         ._M_head_impl)->value + lVar6);
        if ((dVar7 != 0.0) || (NAN(dVar7))) {
          if (dVar7 < 0.0) break;
        }
        else {
          dVar7 = std::
                  generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                            (this->rng);
          if (dVar7 < 0.5) break;
        }
        iVar3 = iVar4 + 1;
        lVar6 = lVar6 + 0x10;
        iVar4 = iVar5;
      } while (((r_size + iVar1) - iVar2) + 1 != iVar3);
    }
  }
  return iVar4 + -1;
}

Assistant:

int select_variables(const int r_size, int bkmin, int bkmax)
    {
        if (bkmin == bkmax)
            return std::min(bkmin, r_size) - 1;

        bkmin = std::min(bkmin, r_size);
        bkmax = std::min(bkmax, r_size);

        for (int i = bkmin; i <= bkmax; ++i)
            if (stop_iterating<Mode>(R[i].value, rng))
                return i - 1;

        return bkmax - 1;
    }